

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShElfRelocator.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
ShElfRelocator::generateCtorStub
          (ShElfRelocator *this,vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors)

{
  char *__s;
  ulong uVar1;
  size_type sVar2;
  reference fmt;
  reference args;
  reference pvVar3;
  string *psVar4;
  vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *in_RDX;
  unsigned_long *in_R9;
  initializer_list<AssemblyTemplateArgument> variables;
  initializer_list<AssemblyTemplateArgument> variables_00;
  AssemblyTemplateArgument *local_350;
  initializer_list<AssemblyTemplateArgument> local_2d8;
  allocator<char> local_2c1;
  AssemblyTemplateArgument local_2c0;
  Identifier local_298;
  Identifier local_278;
  unsigned_long local_258;
  Identifier local_250;
  AssemblyTemplateArgument *local_230;
  AssemblyTemplateArgument local_228;
  char *local_200;
  string local_1f8;
  char *local_1d8;
  string local_1d0 [32];
  char *local_1b0;
  string local_1a8 [32];
  char *local_188;
  string local_180 [32];
  undefined1 local_160 [24];
  undefined1 local_148 [32];
  string local_128;
  ulong local_f8;
  size_t i;
  string table;
  Parser parser;
  vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors_local;
  ShElfRelocator *this_local;
  
  Parser::Parser((Parser *)((long)&table.field_2 + 8));
  sVar2 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::size(in_RDX);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"rts :: nop",&local_2c1)
    ;
    std::initializer_list<AssemblyTemplateArgument>::initializer_list(&local_2d8);
    variables_00._M_len = (size_type)local_2d8._M_array;
    variables_00._M_array = &local_2c0;
    Parser::parseTemplate((Parser *)this,(string *)((long)&table.field_2 + 8),variables_00);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    local_2c0.value.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)&i);
    local_f8 = 0;
    while( true ) {
      uVar1 = local_f8;
      sVar2 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::size(in_RDX);
      __s = shCtorTemplate;
      if (sVar2 <= uVar1) break;
      if (local_f8 != 0) {
        std::__cxx11::string::operator+=((string *)&i,',');
      }
      fmt = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::operator[]
                      (in_RDX,local_f8);
      args = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::operator[]
                       (in_RDX,local_f8);
      pvVar3 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::operator[]
                         (in_RDX,local_f8);
      tinyformat::format<Identifier,Identifier,unsigned_long>
                ((string *)(local_148 + 0x20),(tinyformat *)"%s,%s+0x%08X",(char *)fmt,
                 &args->symbolName,(Identifier *)&pvVar3->size,in_R9);
      std::__cxx11::string::operator+=((string *)&i,(string *)(local_148 + 0x20));
      std::__cxx11::string::~string((string *)(local_148 + 0x20));
      local_f8 = local_f8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,__s,(allocator<char> *)(local_160 + 0x17));
    local_2c0.value.field_2._M_local_buf[0xf] = '\x01';
    local_230 = &local_228;
    local_228.variableName = "%ctorTable%";
    SymbolTable::getUniqueLabelName(&local_250,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_250);
    std::__cxx11::string::string((string *)&local_228.value,(string *)psVar4);
    local_230 = (AssemblyTemplateArgument *)&local_200;
    local_200 = "%ctorTableSize%";
    sVar2 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::size(in_RDX);
    local_258 = sVar2 << 3;
    tinyformat::format<unsigned_long>(&local_1f8,"%d",&local_258);
    local_230 = (AssemblyTemplateArgument *)&local_1d8;
    local_1d8 = "%outerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_278,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_278);
    std::__cxx11::string::string(local_1d0,(string *)psVar4);
    local_230 = (AssemblyTemplateArgument *)&local_1b0;
    local_1b0 = "%innerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_298,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_298);
    std::__cxx11::string::string(local_1a8,(string *)psVar4);
    local_230 = (AssemblyTemplateArgument *)&local_188;
    local_188 = "%ctorContent%";
    std::__cxx11::string::string(local_180,(string *)&i);
    local_2c0.value.field_2._M_local_buf[0xf] = '\0';
    local_160._0_8_ = &local_228;
    local_160._8_8_ = 5;
    variables._M_len = local_160._0_8_;
    variables._M_array = (iterator)local_148;
    Parser::parseTemplate((Parser *)this,(string *)((long)&table.field_2 + 8),variables);
    local_350 = (AssemblyTemplateArgument *)local_160;
    do {
      local_350 = local_350 + -1;
      AssemblyTemplateArgument::~AssemblyTemplateArgument(local_350);
    } while (local_350 != &local_228);
    Identifier::~Identifier(&local_298);
    Identifier::~Identifier(&local_278);
    Identifier::~Identifier(&local_250);
    std::__cxx11::string::~string((string *)local_148);
    std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x17));
    local_2c0.value.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&i);
  }
  Parser::~Parser((Parser *)((long)&table.field_2 + 8));
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> ShElfRelocator::generateCtorStub(std::vector<ElfRelocatorCtor>& ctors)
{
	Parser parser;
	if (ctors.size() != 0)
	{
		// create constructor table
		std::string table;
		for (size_t i = 0; i < ctors.size(); i++)
		{
			if (i != 0)
				table += ',';
			table += tfm::format("%s,%s+0x%08X",ctors[i].symbolName,ctors[i].symbolName,ctors[i].size);
		}

		return parser.parseTemplate(shCtorTemplate,{
			{ "%ctorTable%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorTableSize%",	tfm::format("%d",ctors.size()*8) },
			{ "%outerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%innerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorContent%",		table },
		});
	} else {
		return parser.parseTemplate("rts :: nop");
	}
}